

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O1

void qcc_engine_run_test(qcc_engine *eng,char *name,qcc_test_fn test_fn)

{
  qcc_arena *pqVar1;
  qcc_stream_data_process_fn proc;
  qcc_stream_data data;
  bool bVar2;
  qcc_test_result qVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  qcc_stream *pqVar7;
  qcc_stream *pqVar8;
  uint uVar9;
  long lVar10;
  qcc_stream_interval *pqVar11;
  byte bVar12;
  undefined1 auVar13 [16];
  qcc_stream_data shrinked_data;
  qcc_logger logger;
  qcc_stream stream;
  qcc_stream tmp_stream;
  qcc_stream_data local_108;
  qcc_logger local_f8;
  qcc_logger local_d8;
  qcc_stream local_c0;
  qcc_stream local_78;
  
  bVar12 = 0;
  bVar2 = true;
  if (eng->max_tries == 0) {
    uVar6 = 0;
  }
  else {
    uVar9 = 0;
    uVar6 = 0;
    do {
      qcc_arena_reset(eng->active_arena);
      qcc_stream_init(&local_c0,(qcc_stream_data *)0x0,eng->active_arena);
      qcc_logger_init(&local_f8,eng->active_arena);
      qVar3 = _run_test_once(eng,name,test_fn,&local_c0,&local_f8);
      if (qVar3 == QCC_TEST_FAIL) {
        eng->failed_tests = eng->failed_tests + 1;
        eng->total_tests = eng->total_tests + 1;
        pqVar1 = eng->backup_arena;
        eng->backup_arena = eng->active_arena;
        eng->active_arena = pqVar1;
LAB_0010282d:
        qcc_arena_reset(eng->active_arena);
        lVar10 = 0;
        do {
          if (local_c0.interval_data.first != (qcc_stream_interval *)0x0) {
            proc = (qcc_stream_data_process_fn)(&_run_test_and_shrink_try_shrink)[lVar10];
            bVar2 = false;
            pqVar11 = local_c0.interval_data.first;
            do {
              data.first._1_1_ = local_c0.data.first._1_1_;
              data.first._0_1_ = (char)local_c0.data.first;
              data.first._2_1_ = local_c0.data.first._2_1_;
              data.first._3_1_ = local_c0.data.first._3_1_;
              data.first._4_1_ = local_c0.data.first._4_1_;
              data.first._5_1_ = local_c0.data.first._5_1_;
              data.first._6_1_ = local_c0.data.first._6_1_;
              data.first._7_1_ = local_c0.data.first._7_1_;
              data.last._0_1_ = (char)local_c0.data.last;
              data.last._1_1_ = local_c0.data.last._1_1_;
              data.last._2_1_ = local_c0.data.last._2_1_;
              data.last._3_1_ = local_c0.data.last._3_1_;
              data.last._4_1_ = local_c0.data.last._4_1_;
              data.last._5_1_ = local_c0.data.last._5_1_;
              data.last._6_1_ = local_c0.data.last._6_1_;
              data.last._7_1_ = local_c0.data.last._7_1_;
              local_108 = qcc_stream_data_process
                                    (data,eng->active_arena,pqVar11->begin,pqVar11->end,proc);
              auVar13[0] = -((char)local_108.first == (char)local_c0.data.first);
              auVar13[1] = -(local_108.first._1_1_ == local_c0.data.first._1_1_);
              auVar13[2] = -(local_108.first._2_1_ == local_c0.data.first._2_1_);
              auVar13[3] = -(local_108.first._3_1_ == local_c0.data.first._3_1_);
              auVar13[4] = -(local_108.first._4_1_ == local_c0.data.first._4_1_);
              auVar13[5] = -(local_108.first._5_1_ == local_c0.data.first._5_1_);
              auVar13[6] = -(local_108.first._6_1_ == local_c0.data.first._6_1_);
              auVar13[7] = -(local_108.first._7_1_ == local_c0.data.first._7_1_);
              auVar13[8] = -((char)local_108.last == (char)local_c0.data.last);
              auVar13[9] = -(local_108.last._1_1_ == local_c0.data.last._1_1_);
              auVar13[10] = -(local_108.last._2_1_ == local_c0.data.last._2_1_);
              auVar13[0xb] = -(local_108.last._3_1_ == local_c0.data.last._3_1_);
              auVar13[0xc] = -(local_108.last._4_1_ == local_c0.data.last._4_1_);
              auVar13[0xd] = -(local_108.last._5_1_ == local_c0.data.last._5_1_);
              auVar13[0xe] = -(local_108.last._6_1_ == local_c0.data.last._6_1_);
              auVar13[0xf] = -(local_108.last._7_1_ == local_c0.data.last._7_1_);
              if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar13[0xf] >> 7) << 0xf) == 0xffff) {
                iVar4 = 9;
              }
              else {
                qcc_stream_init(&local_78,&local_108,eng->active_arena);
                qcc_logger_init(&local_d8,eng->active_arena);
                qVar3 = _run_test_once(eng,name,test_fn,&local_78,&local_d8);
                iVar4 = 0;
                if (qVar3 == QCC_TEST_FAIL) {
                  pqVar7 = &local_78;
                  pqVar8 = &local_c0;
                  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
                    pqVar8->arena = pqVar7->arena;
                    pqVar7 = (qcc_stream *)((long)pqVar7 + ((ulong)bVar12 * -2 + 1) * 8);
                    pqVar8 = (qcc_stream *)((long)pqVar8 + ((ulong)bVar12 * -2 + 1) * 8);
                  }
                  local_f8.messages.last = local_d8.messages.last;
                  local_f8.arena = local_d8.arena;
                  local_f8.messages.first = local_d8.messages.first;
                  pqVar1 = eng->backup_arena;
                  eng->backup_arena = eng->active_arena;
                  eng->active_arena = pqVar1;
                  bVar2 = true;
                  iVar4 = 7;
                }
              }
            } while (((iVar4 == 9) || (iVar4 == 0)) &&
                    (pqVar11 = pqVar11->next, pqVar11 != (qcc_stream_interval *)0x0));
            if (bVar2) goto LAB_0010282d;
          }
          lVar10 = lVar10 + 1;
          if (lVar10 == 4) {
            qcc_logger_append(&eng->logger,"%s",&local_f8);
            qVar3 = QCC_TEST_FAIL;
            break;
          }
        } while( true );
      }
      if (qVar3 == QCC_TEST_SUCCEED) {
        uVar6 = uVar6 + 1;
      }
      else if (qVar3 == QCC_TEST_FAIL) {
        bVar2 = false;
        goto LAB_001029bf;
      }
    } while ((uVar6 != eng->required_successes) && (uVar9 = uVar9 + 1, uVar9 != eng->max_tries));
    bVar2 = true;
  }
LAB_001029bf:
  if (bVar2) {
    if (uVar6 == 0) {
      eng->failed_tests = eng->failed_tests + 1;
      eng->total_tests = eng->total_tests + 1;
      qcc_logger_printf(&eng->logger,"%s: ABORTED\n",name);
      qcc_logger_printf(&eng->logger,"    No input was accepted by test as valid\n");
    }
    else {
      eng->total_tests = eng->total_tests + 1;
      if (uVar6 < eng->required_successes) {
        qcc_logger_printf(&eng->logger,"%s:\n",name);
        qcc_logger_printf(&eng->logger,"    Warning: Only %u successful runs out of %u were made\n",
                          (ulong)uVar6,(ulong)eng->required_successes);
      }
    }
  }
  return;
}

Assistant:

void qcc_engine_run_test(struct qcc_engine *eng, const char *name,
                         qcc_test_fn test_fn)
{
    unsigned successes = 0;
    for (unsigned i = 0; i != eng->max_tries; ++i)
    {
        switch (_run_test_and_shrink(eng, name, test_fn))
        {
        case QCC_TEST_SUCCEED:
            ++successes;
            break;
        case QCC_TEST_FAIL:
            return;
        case QCC_TEST_SKIP:
        case QCC_TEST_OVERRUN:
            break;
        }

        if (successes == eng->required_successes) break;
    }

    if (successes == 0)
    {
        qcc_engine_failure(eng);
        qcc_logger_printf(&eng->logger, "%s: ABORTED\n", name);
        qcc_logger_printf(&eng->logger,
                          "    No input was accepted by test as valid\n");
        return;
    }

    ++eng->total_tests;
    if (successes < eng->required_successes)
    {
        qcc_logger_printf(&eng->logger, "%s:\n", name);
        qcc_logger_printf(
            &eng->logger,
            "    Warning: Only %u successful runs out of %u were made\n",
            successes, eng->required_successes);
    }
}